

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

int * StringBuilder<int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
                (int *arg,char (*args) [4],
                basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                char (*args_2) [9])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*in_RDX) [4];
  int *in_RDI;
  char (*in_R8) [9];
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  StringBuilder<int>(in_RDI);
  StringBuilder<char[4],std::__cxx11::string_const&,char_const(&)[9]>(in_RDX,in_RCX,in_R8);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}